

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O1

void glslang::SpecialQualifier
               (char *name,TStorageQualifier qualifier,TBuiltInVariable builtIn,
               TSymbolTable *symbolTable)

{
  int iVar1;
  TSymbol *pTVar2;
  undefined4 extraout_var;
  long lVar3;
  pool_allocator<char> local_58;
  TString local_50;
  
  local_58.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
             name,&local_58);
  pTVar2 = TSymbolTable::find(symbolTable,&local_50,(bool *)0x0,(bool *)0x0,(int *)0x0);
  if (pTVar2 != (TSymbol *)0x0) {
    iVar1 = (*pTVar2->_vptr_TSymbol[0xd])(pTVar2);
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
                      ((long *)CONCAT44(extraout_var,iVar1));
    *(ushort *)(lVar3 + 8) = (ushort)(builtIn << 7) | (ushort)qualifier & 0x7f;
  }
  return;
}

Assistant:

static void SpecialQualifier(const char* name, TStorageQualifier qualifier, TBuiltInVariable builtIn, TSymbolTable& symbolTable)
{
    TSymbol* symbol = symbolTable.find(name);
    if (symbol == nullptr)
        return;

    TQualifier& symQualifier = symbol->getWritableType().getQualifier();
    symQualifier.storage = qualifier;
    symQualifier.builtIn = builtIn;
}